

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O2

real __thiscall fasttext::QMatrix::dotRow(QMatrix *this,Vector *vec,int64_t i)

{
  uint __line;
  real *prVar1;
  char *__assertion;
  real rVar2;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x40;
  }
  else if (i < this->m_) {
    if ((long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 == this->n_) {
      if (this->qnorm_ == true) {
        prVar1 = ProductQuantizer::get_centroids
                           ((this->npq_)._M_t.
                            super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                            .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl
                            ,0,(this->norm_codes_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[i]);
        rVar2 = *prVar1;
      }
      else {
        rVar2 = 1.0;
      }
      rVar2 = ProductQuantizer::mulcode
                        ((this->pq_)._M_t.
                         super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                         .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                         vec,(this->codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(int32_t)i,rVar2);
      return rVar2;
    }
    __assertion = "vec.size() == n_";
    __line = 0x42;
  }
  else {
    __assertion = "i < m_";
    __line = 0x41;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,__line,"real fasttext::QMatrix::dotRow(const Vector &, int64_t) const");
}

Assistant:

real QMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[i])[0];
  }
  return pq_->mulcode(vec, codes_.data(), i, norm);
}